

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::strTree<kj::Repeat<char>,kj::CappedArray<char,14ul>&,char_const(&)[2]>
          (StringTree *__return_storage_ptr__,kj *this,Repeat<char> *params,
          CappedArray<char,_14UL> *params_1,char (*params_2) [2])

{
  ArrayPtr<const_char> local_50;
  size_t *local_40;
  size_t local_38;
  kj local_30;
  char *local_28;
  
  local_30 = *this;
  local_28 = *(char **)(this + 8);
  local_38 = *(size_t *)params;
  local_40 = &params->count;
  local_50.size_ = strlen((char *)params_1);
  local_50.ptr = (char *)params_1;
  StringTree::concat<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_30,(Repeat<char> *)&local_40,&local_50,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}